

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O3

void * OPENSSL_sk_delete(OPENSSL_STACK *sk,size_t where)

{
  void **__dest;
  ulong uVar1;
  size_t sVar2;
  size_t __n;
  void *pvVar3;
  
  if ((sk == (OPENSSL_STACK *)0x0) || (uVar1 = sk->num, uVar1 <= where)) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = sk->data[where];
    sVar2 = uVar1 - 1;
    if ((sVar2 != where) && (__n = (uVar1 + ~where) * 8, __n != 0)) {
      __dest = sk->data + where;
      memmove(__dest,__dest + 1,__n);
      sVar2 = sk->num - 1;
    }
    sk->num = sVar2;
  }
  return pvVar3;
}

Assistant:

void *OPENSSL_sk_delete(OPENSSL_STACK *sk, size_t where) {
  void *ret;

  if (!sk || where >= sk->num) {
    return NULL;
  }

  ret = sk->data[where];

  if (where != sk->num - 1) {
    OPENSSL_memmove(&sk->data[where], &sk->data[where + 1],
                    sizeof(void *) * (sk->num - where - 1));
  }

  sk->num--;
  return ret;
}